

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<long>::Subst_LForward(TPZMatrix<long> *this,TPZFMatrix<long> *B)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_38;
  
  lVar6 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar6 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar6 = 0;
    do {
      if (0 < (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
        lVar4 = 0;
        do {
          if (lVar6 == 0) {
            lVar5 = 0;
          }
          else {
            lVar3 = 0;
            lVar5 = 0;
            do {
              iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                (this,lVar6,lVar3);
              iVar2 = (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable[0x24])(B,lVar3,lVar4);
              lVar5 = lVar5 + CONCAT44(extraout_var_02,iVar2) * CONCAT44(extraout_var_01,iVar1);
              lVar3 = lVar3 + 1;
            } while (lVar6 != lVar3);
          }
          iVar1 = (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                    [0x24])(B,lVar6,lVar4);
          local_38 = CONCAT44(extraout_var_03,iVar1) - lVar5;
          (*(B->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                    (B,lVar6,lVar4,&local_38);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol);
      }
      lVar6 = lVar6 + 1;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    } while (lVar6 < CONCAT44(extraout_var_04,iVar1));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}